

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate.c
# Opt level: O2

void arm_translate_init_arm(uc_struct_conflict1 *uc)

{
  TCGContext_conflict *tcg_ctx;
  TCGv_i32 pTVar1;
  TCGv_i64 pTVar2;
  long offset;
  
  tcg_ctx = uc->tcg_ctx;
  for (offset = 0; offset != 0x40; offset = offset + 4) {
    pTVar1 = tcg_global_mem_new_i32
                       (tcg_ctx,tcg_ctx->cpu_env,offset,
                        (char *)((long)&regnames_rel + (long)*(int *)((long)&regnames_rel + offset))
                       );
    *(TCGv_i32 *)((long)tcg_ctx->cpu_R + offset * 2) = pTVar1;
  }
  pTVar1 = tcg_global_mem_new_i32(tcg_ctx,tcg_ctx->cpu_env,0x208,"CF");
  tcg_ctx->cpu_CF = pTVar1;
  pTVar1 = tcg_global_mem_new_i32(tcg_ctx,tcg_ctx->cpu_env,0x210,"NF");
  tcg_ctx->cpu_NF = pTVar1;
  pTVar1 = tcg_global_mem_new_i32(tcg_ctx,tcg_ctx->cpu_env,0x20c,"VF");
  tcg_ctx->cpu_VF = pTVar1;
  pTVar1 = tcg_global_mem_new_i32(tcg_ctx,tcg_ctx->cpu_env,0x214,"ZF");
  tcg_ctx->cpu_ZF = pTVar1;
  pTVar2 = tcg_global_mem_new_i64(tcg_ctx,tcg_ctx->cpu_env,0xec0,"exclusive_addr");
  tcg_ctx->cpu_exclusive_addr = pTVar2;
  pTVar2 = tcg_global_mem_new_i64(tcg_ctx,tcg_ctx->cpu_env,0xec8,"exclusive_val");
  tcg_ctx->cpu_exclusive_val = pTVar2;
  return;
}

Assistant:

void arm_translate_init(struct uc_struct *uc)
{
    TCGContext *tcg_ctx = uc->tcg_ctx;
    int i;

    for (i = 0; i < 16; i++) {
        tcg_ctx->cpu_R[i] = tcg_global_mem_new_i32(tcg_ctx, tcg_ctx->cpu_env,
                                          offsetof(CPUARMState, regs[i]),
                                          regnames[i]);
    }
    tcg_ctx->cpu_CF = tcg_global_mem_new_i32(tcg_ctx, tcg_ctx->cpu_env, offsetof(CPUARMState, CF), "CF");
    tcg_ctx->cpu_NF = tcg_global_mem_new_i32(tcg_ctx, tcg_ctx->cpu_env, offsetof(CPUARMState, NF), "NF");
    tcg_ctx->cpu_VF = tcg_global_mem_new_i32(tcg_ctx, tcg_ctx->cpu_env, offsetof(CPUARMState, VF), "VF");
    tcg_ctx->cpu_ZF = tcg_global_mem_new_i32(tcg_ctx, tcg_ctx->cpu_env, offsetof(CPUARMState, ZF), "ZF");

    tcg_ctx->cpu_exclusive_addr = tcg_global_mem_new_i64(tcg_ctx, tcg_ctx->cpu_env,
        offsetof(CPUARMState, exclusive_addr), "exclusive_addr");
    tcg_ctx->cpu_exclusive_val = tcg_global_mem_new_i64(tcg_ctx, tcg_ctx->cpu_env,
        offsetof(CPUARMState, exclusive_val), "exclusive_val");

    a64_translate_init(uc);
}